

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

SerializedMessage * __thiscall
miniros::serialization::serializeMessage<rosgraph_msgs::Log_<std::allocator<void>>>
          (SerializedMessage *__return_storage_ptr__,serialization *this,
          Log_<std::allocator<void>_> *message)

{
  int *piVar1;
  int *piVar2;
  uchar *__p;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint8_t *old_data;
  OStream local_38;
  
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  iVar5 = 4;
  for (lVar6 = *(long *)(this + 0xc0); lVar6 != *(long *)(this + 200); lVar6 = lVar6 + 0x20) {
    iVar5 = iVar5 + *(int *)(lVar6 + 8) + 4;
  }
  uVar4 = (ulong)(iVar5 + (int)*(undefined8 *)(this + 0x60) + (int)*(undefined8 *)(this + 0x80) +
                          (int)*(undefined8 *)(this + 0x40) + (int)*(undefined8 *)(this + 0x18) +
                          (int)*(undefined8 *)(this + 0xa0) + 0x29);
  __return_storage_ptr__->num_bytes = uVar4;
  __p = (uchar *)operator_new__(uVar4);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,__p
            );
  piVar2 = (int *)(__return_storage_ptr__->buf).
                  super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = __return_storage_ptr__->num_bytes;
  uVar3 = uVar4 & 0xffffffff;
  local_38.super_Stream.end_ = (uint8_t *)((long)piVar2 + uVar3);
  piVar1 = piVar2 + 1;
  local_38.super_Stream.data_ = (uint8_t *)piVar1;
  if (uVar3 < 4) {
    throwStreamOverrun();
  }
  *piVar2 = (int)uVar4 + -4;
  __return_storage_ptr__->message_start = (uint8_t *)piVar1;
  Serializer<rosgraph_msgs::Log_<std::allocator<void>>>::
  allInOne<miniros::serialization::OStream,rosgraph_msgs::Log_<std::allocator<void>>const&>
            (&local_38,(Log_<std::allocator<void>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeMessage(const M& message)
{
  SerializedMessage m;
  uint32_t len = serializationLength(message);
  m.num_bytes = len + 4;
  m.buf.reset(new uint8_t[m.num_bytes]);

  OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
  serialize(s, static_cast<uint32_t>(m.num_bytes) - 4);
  m.message_start = s.getData();
  serialize(s, message);

  return m;
}